

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::AppendEcho
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *text,EchoColor color,EchoProgress *progress)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  cmOutputConverter *this_00;
  string line;
  string color_name;
  string cmd;
  string local_b0;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  value_type local_50;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  if (((((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
        ToolSupportsColor == true) && (this->ColorMakefile == true)) && (color - EchoDepend < 5)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_70,0,(char *)0x0,
               (ulong)(&DAT_004e02ac + *(int *)(&DAT_004e02ac + (ulong)(color - EchoDepend) * 4)));
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_90);
  pcVar3 = (text->_M_dataplus)._M_p;
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  do {
    cVar1 = *pcVar3;
    if (cVar1 != '\r') {
      if (cVar1 == '\n') {
LAB_0038aedc:
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        if (local_68 == 0 && progress == (EchoProgress *)0x0) {
          std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x4dfd19);
          cmOutputConverter::EscapeForShell(&local_b0,this_00,&local_90,false,true,false);
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x4dfd20);
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
          if (progress != (EchoProgress *)0x0) {
            std::__cxx11::string::append((char *)&local_50);
            cmOutputConverter::Convert(&local_b0,this_00,&progress->Dir,FULL,SHELL);
            std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&local_50);
            std::__cxx11::string::append((char *)&local_50);
            std::__cxx11::string::_M_append
                      ((char *)&local_50,(ulong)(progress->Arg)._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_50);
          }
          cmOutputConverter::EscapeForShell(&local_b0,this_00,&local_90,false,false,false);
          std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(commands,&local_50);
        pcVar2 = (char *)local_90._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
          pcVar2 = (char *)local_90._M_string_length;
        }
      }
      else {
        if (cVar1 != '\0') {
          std::__cxx11::string::push_back((char)&local_90);
          goto LAB_0038b0b2;
        }
        if ((char *)local_90._M_string_length != (char *)0x0) goto LAB_0038aedc;
        pcVar2 = (char *)0x0;
      }
      std::__cxx11::string::_M_replace((ulong)&local_90,0,pcVar2,0x50caef);
      if (*pcVar3 == '\0') {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
        }
        return;
      }
      progress = (EchoProgress *)0x0;
    }
LAB_0038b0b2:
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void
cmLocalUnixMakefileGenerator3::AppendEcho(std::vector<std::string>& commands,
                                          std::string const& text,
                                          EchoColor color,
                                          EchoProgress const* progress)
{
  // Choose the color for the text.
  std::string color_name;
  if(this->GlobalGenerator->GetToolSupportsColor() && this->ColorMakefile)
    {
    // See cmake::ExecuteEchoColor in cmake.cxx for these options.
    // This color set is readable on both black and white backgrounds.
    switch(color)
      {
      case EchoNormal:
        break;
      case EchoDepend:
        color_name = "--magenta --bold ";
        break;
      case EchoBuild:
        color_name = "--green ";
        break;
      case EchoLink:
        color_name = "--green --bold ";
        break;
      case EchoGenerate:
        color_name = "--blue --bold ";
        break;
      case EchoGlobal:
        color_name = "--cyan ";
        break;
      }
    }

  // Echo one line at a time.
  std::string line;
  line.reserve(200);
  for(const char* c = text.c_str();; ++c)
    {
    if(*c == '\n' || *c == '\0')
      {
      // Avoid writing a blank last line on end-of-string.
      if(*c != '\0' || !line.empty())
        {
        // Add a command to echo this line.
        std::string cmd;
        if(color_name.empty() && !progress)
          {
          // Use the native echo command.
          cmd = "@echo ";
          cmd += this->EscapeForShell(line, false, true);
          }
        else
          {
          // Use cmake to echo the text in color.
          cmd = "@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ";
          cmd += color_name;
          if (progress)
            {
            cmd += "--progress-dir=";
            cmd += this->Convert(progress->Dir,
                                 cmLocalGenerator::FULL,
                                 cmLocalGenerator::SHELL);
            cmd += " ";
            cmd += "--progress-num=";
            cmd += progress->Arg;
            cmd += " ";
            }
          cmd += this->EscapeForShell(line);
          }
        commands.push_back(cmd);
        }

      // Reset the line to emtpy.
      line = "";

      // Progress appears only on first line.
      progress = 0;

      // Terminate on end-of-string.
      if(*c == '\0')
        {
        return;
        }
      }
    else if(*c != '\r')
      {
      // Append this character to the current line.
      line += *c;
      }
    }
}